

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

int fmt::v11::detail::compare(bigint *b1,bigint *b2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  
  iVar6 = (int)(b1->bigits_).super_buffer<unsigned_int>.size_;
  iVar4 = b1->exp_ + iVar6;
  iVar9 = (int)(b2->bigits_).super_buffer<unsigned_int>.size_;
  iVar5 = b2->exp_ + iVar9;
  bVar12 = SBORROW4(iVar4,iVar5);
  bVar11 = iVar4 - iVar5 < 0;
  bVar10 = iVar4 == iVar5;
  if (bVar10) {
    uVar3 = 0;
    if (0 < iVar6 - iVar9) {
      uVar3 = iVar6 - iVar9;
    }
    lVar7 = (long)iVar6;
    lVar8 = (long)iVar9;
    while ((long)(ulong)uVar3 < lVar7) {
      uVar1 = (b1->bigits_).super_buffer<unsigned_int>.ptr_[lVar7 + -1];
      lVar7 = lVar7 + -1;
      uVar2 = (b2->bigits_).super_buffer<unsigned_int>.ptr_[lVar8 + -1];
      lVar8 = lVar8 + -1;
      if (uVar1 != uVar2) {
        return (uVar2 < uVar1) - 1 | 1;
      }
    }
    bVar12 = SBORROW8(lVar7,lVar8);
    bVar11 = lVar7 - lVar8 < 0;
    bVar10 = lVar7 == lVar8;
    if (bVar10) {
      return 0;
    }
  }
  return (uint)(!bVar10 && bVar12 == bVar11) * 2 + -1;
}

Assistant:

constexpr auto size() const noexcept -> size_t { return size_; }